

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.h
# Opt level: O0

bool __thiscall xray_re::_vector3<float>::operator<(_vector3<float> *this,_vector3<float> *right)

{
  float *pfVar1;
  float fVar2;
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool local_19;
  _vector3<float> *right_local;
  _vector3<float> *this_local;
  
  local_19 = true;
  if ((right->field_0).field_0.x <= (this->field_0).field_0.x) {
    fVar2 = (this->field_0).field_0.x;
    local_29 = false;
    if ((fVar2 == (right->field_0).field_0.x) && (!NAN(fVar2) && !NAN((right->field_0).field_0.x)))
    {
      local_2a = true;
      if ((right->field_0).field_0.y <= (this->field_0).field_0.y) {
        fVar2 = (this->field_0).field_0.y;
        pfVar1 = &(right->field_0).field_0.y;
        local_2b = false;
        if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
          local_2b = (this->field_0).field_0.z < (right->field_0).field_0.z;
        }
        local_2a = local_2b;
      }
      local_29 = local_2a;
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

inline bool _vector3<T>::operator<(const _vector3<T>& right) const
{
	return x < right.x || (x == right.x && (y < right.y || (y == right.y && z < right.z)));
}